

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.c
# Opt level: O0

void lace_exec_in_new_frame(WorkerP *__lace_worker,Task *__lace_dq_head,Task *root)

{
  uint8_t uVar1;
  uint uVar2;
  __int_type _Var3;
  Worker *pWVar4;
  TailSplit TVar5;
  TailSplit TVar6;
  Worker *wt_1;
  TailSplitNA_conflict ts_new;
  Worker *wt;
  uint8_t old_as;
  TailSplitNA_conflict old;
  Task *root_local;
  Task *__lace_dq_head_local;
  WorkerP *__lace_worker_local;
  
  pWVar4 = __lace_worker->_public;
  uVar1 = pWVar4->allstolen;
  pWVar4->allstolen = '\x01';
  uVar2 = *(uint *)((long)&pWVar4->ts + 4);
  LOCK();
  (pWVar4->ts).ts.split.super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  _Var3 = (pWVar4->ts).ts.tail.super___atomic_base<unsigned_int>._M_i;
  TVar5.ts.split.super___atomic_base<unsigned_int>._M_i =
       (atomic<unsigned_int>)
       (atomic<unsigned_int>)(int)((ulong)((long)__lace_dq_head - (long)__lace_worker->dq) >> 6);
  TVar5.ts.tail.super___atomic_base<unsigned_int>._M_i =
       (atomic<unsigned_int>)
       (atomic<unsigned_int>)(int)((ulong)((long)__lace_dq_head - (long)__lace_worker->dq) >> 6);
  LOCK();
  pWVar4->ts = TVar5;
  UNLOCK();
  __lace_worker->split = __lace_dq_head;
  __lace_worker->allstolen = '\x01';
  lace_barrier();
  (*root->f)(__lace_worker,__lace_dq_head,root);
  lace_barrier();
  pWVar4 = __lace_worker->_public;
  pWVar4->allstolen = uVar1;
  TVar6.ts.split.super___atomic_base<unsigned_int>._M_i =
       (atomic<unsigned_int>)(atomic<unsigned_int>)uVar2;
  TVar6.ts.tail.super___atomic_base<unsigned_int>._M_i =
       (atomic<unsigned_int>)(atomic<unsigned_int>)_Var3;
  LOCK();
  pWVar4->ts = TVar6;
  UNLOCK();
  __lace_worker->split = __lace_worker->dq + uVar2;
  __lace_worker->allstolen = uVar1;
  return;
}

Assistant:

void
lace_exec_in_new_frame(WorkerP *__lace_worker, Task *__lace_dq_head, Task *root)
{
    TailSplitNA old;
    uint8_t old_as;

    // save old tail, split, allstolen and initiate new frame
    {
        Worker *wt = __lace_worker->_public;

        old_as = wt->allstolen;
        wt->allstolen = 1;
        old.ts.split = wt->ts.ts.split;
        wt->ts.ts.split = 0;
        atomic_thread_fence(memory_order_seq_cst);
        old.ts.tail = wt->ts.ts.tail;

        TailSplitNA ts_new;
        ts_new.ts.tail = __lace_dq_head - __lace_worker->dq;
        ts_new.ts.split = __lace_dq_head - __lace_worker->dq;
        wt->ts.v = ts_new.v;

        __lace_worker->split = __lace_dq_head;
        __lace_worker->allstolen = 1;
    }

    // wait until all workers are ready
    lace_barrier();

    // execute task
    root->f(__lace_worker, __lace_dq_head, root);

    // wait until all workers are back (else they may steal from previous frame)
    lace_barrier();

    // restore tail, split, allstolen
    {
        Worker *wt = __lace_worker->_public;
        wt->allstolen = old_as;
        wt->ts.v = old.v;
        __lace_worker->split = __lace_worker->dq + old.ts.split;
        __lace_worker->allstolen = old_as;
    }
}